

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

void __thiscall deqp::gls::MultiTextureSamplerTest::render(MultiTextureSamplerTest *this)

{
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  GLint GVar4;
  GLint GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  IndexType local_b0;
  void *local_a8;
  undefined1 local_88 [48];
  VertexArrayPointer local_58;
  long lVar7;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar7 + 0x1680))((this->m_program->m_program).m_program);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x318);
  GVar4 = glwGetUniformLocation((this->m_program->m_program).m_program,"u_sampler1");
  if (GVar4 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"samplerLoc1 != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
               ,0x31b);
  }
  else {
    GVar5 = glwGetUniformLocation((this->m_program->m_program).m_program,"u_sampler2");
    if (GVar5 == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"samplerLoc2 != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                 ,0x31e);
    }
    else {
      GVar6 = glwGetUniformLocation((this->m_program->m_program).m_program,"u_posScale");
      if (GVar6 != -1) {
        (**(code **)(lVar7 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
        dVar3 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar3,"glClearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x324);
        (**(code **)(lVar7 + 0x188))(0x4000);
        dVar3 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar3,"glClear(GL_COLOR_BUFFER_BIT)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x327);
        (**(code **)(lVar7 + 0x14f0))(GVar4,0);
        dVar3 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar3,"glUniform1i(samplerLoc1, 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x32a);
        (**(code **)(lVar7 + 0x14f0))(GVar5,1);
        dVar3 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar3,"glUniform1i(samplerLoc2, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x32d);
        (**(code **)(lVar7 + 0x14e0))(0x3f800000,GVar6);
        dVar3 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar3,"glUniform1f(scaleLoc, 1.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                        ,0x330);
        GVar1 = this->m_target;
        if (GVar1 == 0x8513) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"a_position",&local_d9);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_b8,&local_d8,0);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_88,(BindingPoint *)local_b8);
          local_58.componentType = VTX_COMP_FLOAT;
          local_58.convert = VTX_COMP_CONVERT_NONE;
          local_58.numComponents = 4;
          local_58.numElements = 6;
          local_58.stride = 0;
          local_58.data = s_positionsCube;
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d8);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
          (**(code **)(lVar7 + 0x14e0))(0x3e800000,GVar6);
          dVar3 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                          ,0x360);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
        }
        else if (GVar1 == 0x806f) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"a_position",&local_d9);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_b8,&local_d8,0);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_88,(BindingPoint *)local_b8);
          local_58.componentType = VTX_COMP_FLOAT;
          local_58.convert = VTX_COMP_CONVERT_NONE;
          local_58.numComponents = 3;
          local_58.numElements = 6;
          local_58.stride = 0;
          local_58.data = s_positions3D;
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d8);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
          (**(code **)(lVar7 + 0x14e0))(0x3e800000,GVar6);
          dVar3 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                          ,0x34f);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
        }
        else {
          if (GVar1 != 0xde1) {
            return;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"a_position",&local_d9);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_b8,&local_d8,0);
          glu::BindingPoint::BindingPoint((BindingPoint *)local_88,(BindingPoint *)local_b8);
          local_58.componentType = VTX_COMP_FLOAT;
          local_58.convert = VTX_COMP_CONVERT_NONE;
          local_58.numComponents = 2;
          local_58.numElements = 6;
          local_58.stride = 0;
          local_58.data = s_positions;
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d8);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
          (**(code **)(lVar7 + 0x14e0))(0x3e800000,GVar6);
          dVar3 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar3,"glUniform1f(scaleLoc, 0.25f)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                          ,0x33e);
          local_b8 = (undefined1  [8])0x600000000;
          local_b0 = INDEXTYPE_LAST;
          local_a8 = (void *)0x0;
          glu::draw(this->m_renderCtx,(this->m_program->m_program).m_program,1,
                    (VertexArrayBinding *)local_88,(PrimitiveList *)local_b8,(DrawUtilCallback *)0x0
                   );
        }
        std::__cxx11::string::~string((string *)(local_88 + 8));
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"scaleLoc != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                 ,0x321);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MultiTextureSamplerTest::render (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLuint	samplerLoc1	= (GLuint)-1;
	GLuint	samplerLoc2	= (GLuint)-1;
	GLuint	scaleLoc	= (GLuint)-1;

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram(m_program->getProgram())");

	samplerLoc1 = glGetUniformLocation(m_program->getProgram(), "u_sampler1");
	TCU_CHECK(samplerLoc1 != (GLuint)-1);

	samplerLoc2 = glGetUniformLocation(m_program->getProgram(), "u_sampler2");
	TCU_CHECK(samplerLoc2 != (GLuint)-1);

	scaleLoc = glGetUniformLocation(m_program->getProgram(), "u_posScale");
	TCU_CHECK(scaleLoc != (GLuint)-1);

	gl.clearColor(0.5f, 0.5f, 0.5f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor(0.5f, 0.5f, 0.5f, 1.0f)");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear(GL_COLOR_BUFFER_BIT)");

	gl.uniform1i(samplerLoc1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i(samplerLoc1, 0)");

	gl.uniform1i(samplerLoc2, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i(samplerLoc2, 1)");

	gl.uniform1f(scaleLoc, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 1.0f)");

	switch (m_target)
	{
		case GL_TEXTURE_2D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 2, 6, 0, s_positions))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_3D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 3, 6, 0, s_positions3D))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_CUBE_MAP:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 4, 6, 0, s_positionsCube))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		default:
			DE_ASSERT(false);
	}
}